

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

int htmlParseCharData(htmlParserCtxtPtr ctxt,int partial)

{
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  xmlParserInputPtr pxVar5;
  xmlParserInputPtr pxVar6;
  int iVar7;
  ulong uVar8;
  xmlChar *pxVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar14;
  size_t oldAvail;
  ulong len;
  int iVar15;
  long lVar16;
  byte *pbVar17;
  ulong uVar18;
  bool bVar19;
  ulong uVar20;
  byte *pbVar21;
  byte *str;
  byte *pbVar22;
  ulong uStack_b0;
  uint local_a8;
  uint local_a4;
  int local_a0;
  uint local_9c;
  int skip;
  byte *local_88;
  ulong local_80;
  int local_78;
  int replSize;
  htmlParserCtxtPtr local_70;
  long local_68;
  ulong local_60;
  xmlChar *local_58;
  int local_4c;
  byte *local_48;
  undefined8 local_40;
  xmlChar utf8Char [4];
  ulong uVar13;
  
  pxVar5 = ctxt->input;
  local_a8 = pxVar5->flags & 0x40;
  local_80 = (ulong)(uint)ctxt->endCheckState;
  local_4c = pxVar5->line;
  local_40 = 0;
  uVar13 = (ulong)(uint)pxVar5->col;
  local_78 = partial;
  local_70 = ctxt;
LAB_00164c34:
  do {
    iVar7 = ctxt->disableSAX;
    if (1 < iVar7) break;
    skip = 0;
    pbVar17 = pxVar5->cur;
    replSize = 0;
    len = (long)pxVar5->end - (long)pbVar17;
    local_58 = "";
    iVar15 = 0;
    local_a4 = 0;
    local_a0 = 0;
    pbVar22 = pbVar17;
LAB_00164c77:
    if (iVar7 < 2) {
      uVar8 = len;
      pbVar21 = pbVar22;
      if (len < 0x41) {
        if (local_a8 == 0) {
          lVar16 = (long)pbVar17 - (long)pbVar22;
          pxVar5->cur = pbVar22;
          xmlParserGrow(ctxt);
          pbVar22 = pxVar5->cur;
          pbVar17 = pbVar22 + lVar16;
          pxVar5->cur = pbVar17;
          uVar8 = (long)pxVar5->end - (long)pbVar22;
          local_a8 = (uint)(len == uVar8);
          ctxt = local_70;
        }
        bVar19 = true;
        pbVar21 = pbVar22;
        if (uVar8 != 0) goto LAB_00164cef;
        local_9c = 0;
        uVar14 = uVar13;
        if (local_78 == 0 || iVar15 == 0) goto LAB_00165436;
        pbVar22 = pbVar22 + -(long)(int)local_a4;
        local_60 = uVar13;
        goto LAB_00165368;
      }
LAB_00164cef:
      iVar7 = local_78;
      local_9c = 1;
      iVar11 = (int)uVar13;
      if (iVar15 == 0) {
        uVar12 = iVar11 + (int)uVar8;
        str = pbVar21 + uVar8;
        uVar14 = uVar13 & 0xffffffff;
        pbVar22 = pbVar21;
        for (uVar20 = 0; len = uVar8 - uVar20, len != 0; uVar20 = uVar20 + 1) {
          bVar3 = pbVar21[uVar20];
          if ((htmlParseCharData::mask[bVar3 >> 5] >> (bVar3 & 0x1f) & 1) != 0) {
            uVar18 = uVar13 & 0xffffffff;
            str = pbVar21 + uVar20;
            iVar15 = (int)uVar20;
            local_88 = str;
            if ((local_a8 == 0) && (len < 0x41)) {
              uVar12 = iVar11 + iVar15;
              iVar15 = 0;
              local_a8 = 0;
              goto LAB_00164def;
            }
            if (bVar3 == 10) {
              local_4c = local_4c + 1;
              uVar12 = local_9c;
              goto LAB_00164fd7;
            }
            uVar1 = uVar8 - 1;
            uVar2 = uVar8 - 2;
            uVar14 = (ulong)((int)uVar14 + 1);
            local_68 = uVar18 + uVar20 + 1;
            uVar12 = (uint)local_68;
            if (bVar3 == 0x26) {
              local_60 = uVar13;
              if (1 < (uint)local_80) goto LAB_00164fd7;
              if ((uVar1 != uVar20) && (pbVar21[uVar20 + 1] == 0x23)) {
                iVar15 = 0;
                if (uVar2 == uVar20) {
                  uStack_b0 = 2;
                }
                else if ((pbVar21[uVar20 + 2] & 0xdf) == 0x58) {
                  if ((len < 4) ||
                     ((9 < (byte)(pbVar21[uVar20 + 3] - 0x30) &&
                      (5 < (byte)((pbVar21[uVar20 + 3] | 0x20) + 0x9f))))) {
                    uStack_b0 = 3;
                  }
                  else {
                    local_a0 = 0;
                    iVar15 = 0x10;
                    local_9c = 3;
                    uStack_b0 = 3;
                    local_a4 = local_9c;
                  }
                }
                else if ((byte)(pbVar21[uVar20 + 2] - 0x30) < 10) {
                  local_a0 = 0;
                  iVar15 = 10;
                  local_9c = 2;
                  uStack_b0 = 2;
                  local_a4 = local_9c;
                }
                else {
                  uStack_b0 = 2;
                }
                goto LAB_00165261;
              }
              if (local_78 == 0) goto LAB_001650a6;
              uVar18 = 1;
              goto LAB_0016501c;
            }
            if (bVar3 != 0x2d) {
              if (bVar3 == 0x3c) {
                local_60 = uVar13;
                if ((uint)local_80 == 3) goto LAB_00164fd7;
                if ((uint)local_80 == 0) goto LAB_001654c8;
                uVar8 = local_80;
                if (uVar1 == uVar20) {
                  uStack_b0 = 1;
                  goto LAB_00164f93;
                }
                bVar3 = pbVar21[uVar20 + 1];
                if (((uint)local_80 == 4) && (bVar3 == 0x21)) {
                  uStack_b0 = 2;
                  uVar8 = 4;
                  if ((uVar2 != uVar20) &&
                     ((uStack_b0 = 2, pbVar21[uVar20 + 2] == 0x2d && (uStack_b0 = 3, 3 < len)))) {
                    uVar8 = (ulong)(pbVar21[uVar20 + 3] == 0x2d | 4);
                  }
                  goto LAB_00164f93;
                }
                uVar20 = (ulong)(bVar3 == 0x2f) + 1;
                if ((bVar3 != 0x2f) && (uStack_b0 = uVar20, (uint)local_80 != 5)) goto LAB_00164f93;
                uVar18 = 0;
                goto LAB_00165188;
              }
              if (bVar3 == 0) {
                replSize = 3;
                uVar14 = (ulong)(iVar11 + iVar15 + 1);
                local_58 = (xmlChar *)anon_var_dwarf_119d1;
              }
              else {
                if (bVar3 != 0xd) {
                  local_60 = uVar13;
                  if (-1 < (char)bVar3) goto LAB_00164fd7;
                  if ((pxVar5->flags & 1) == 0) {
                    pbVar22 = pbVar21 + uVar20;
                    uVar14 = uVar18 + uVar20 + 1;
                    if (pbVar17 < pbVar22) {
                      local_9c = 0;
                      bVar19 = false;
                      goto LAB_0016531e;
                    }
                    pxVar9 = htmlFindEncoding(ctxt);
                    if (pxVar9 == (xmlChar *)0x0) {
                      xmlSwitchEncoding(ctxt,XML_CHAR_ENCODING_8859_1);
                    }
                    else {
                      xmlSwitchEncodingName(ctxt,(char *)pxVar9);
                      (*xmlFree)(pxVar9);
                    }
                    *(byte *)&pxVar5->flags = (byte)pxVar5->flags | 1;
                    local_a8 = ctxt->input->flags & 0x40;
                    uVar13 = uVar14;
                    goto LAB_00164c34;
                  }
                  local_48 = pbVar17;
                  local_9c = htmlValidateUtf8(ctxt,str,len,local_78);
                  ctxt = local_70;
                  pbVar17 = local_48;
                  if ((iVar7 != 0) && (local_9c == 0)) {
                    local_9c = 0;
                    bVar19 = true;
                    goto LAB_0016531e;
                  }
                  if ((int)local_9c < 1) {
                    skip = 1;
                    replSize = 3;
                    uVar14 = (ulong)((int)local_60 + iVar15 + 1);
                    pbVar22 = pbVar21 + uVar20;
                    bVar19 = false;
                    local_9c = 1;
                    local_58 = (xmlChar *)anon_var_dwarf_119d1;
                    goto LAB_0016531e;
                  }
                  iVar15 = 0;
                  uVar12 = (uint)local_68;
                  str = local_88;
                  goto LAB_00164d90;
                }
                pbVar22 = pbVar21 + uVar20;
                uVar14 = uVar18 + uVar20 + 1;
                if ((local_78 != 0) && (uVar1 == uVar20)) goto LAB_00165623;
                skip = 1;
                if (pbVar21[uVar20 + 1] == 10) {
                  bVar19 = false;
                  goto LAB_0016531e;
                }
                replSize = 1;
                local_58 = "\n";
              }
              skip = 1;
              bVar19 = false;
              pbVar22 = pbVar21 + uVar20;
              goto LAB_0016531e;
            }
            local_60 = uVar13;
            if ((uint)local_80 - 7 < 0xfffffffe) goto LAB_00164fd7;
            if ((uVar1 == uVar20) || (pbVar21[uVar20 + 1] != 0x2d)) {
              uStack_b0 = 1;
            }
            else {
              if (uVar2 != uVar20) {
                if (pbVar21[uVar20 + 2] == 0x3e) {
                  local_80 = 4;
                }
                local_80 = local_80 & 0xffffffff;
              }
              uStack_b0 = 2;
            }
            if ((local_78 != 0) && (len <= uStack_b0)) goto LAB_00165436;
            iVar15 = 0;
            goto LAB_00164d90;
          }
          uVar14 = (ulong)((int)uVar14 + 1);
          pbVar22 = pbVar22 + 1;
        }
        len = 0;
        iVar15 = 0;
        goto LAB_00164def;
      }
      bVar3 = *pbVar21;
      uVar12 = iVar11 + 1;
      uVar13 = (ulong)uVar12;
      if ((byte)(bVar3 - 0x30) < 10) {
        iVar7 = bVar3 - 0x30;
LAB_00164d78:
        local_a0 = local_a0 * iVar15 + iVar7;
        if (0x10ffff < local_a0) {
          local_a0 = 0x110000;
        }
        local_a4 = local_a4 + 1;
        len = uVar8;
        str = pbVar21;
        goto LAB_00164d90;
      }
      if (iVar15 == 0x10) {
        iVar15 = 0x10;
        uVar10 = bVar3 | 0x20;
        if (uVar10 - 0x61 < 6) {
          iVar7 = uVar10 - 0x57;
          goto LAB_00164d78;
        }
      }
      uVar12 = (uint)(bVar3 == 0x3b);
      pbVar22 = pbVar21 + uVar12;
      local_a4 = local_a4 + uVar12;
    }
    bVar19 = false;
    uVar14 = uVar13;
LAB_00165319:
    local_9c = 0;
LAB_0016531e:
    local_60 = uVar14;
    if (0 < (int)local_a4) {
      skip = local_a4;
      pbVar22 = pbVar22 + -(ulong)local_a4;
      htmlCodePointToUtf8(local_a0,utf8Char,&replSize);
      ctxt = local_70;
      local_9c = local_a4;
      local_58 = utf8Char;
    }
LAB_00165368:
    pxVar9 = pxVar5->cur;
    lVar16 = (long)pbVar22 - (long)pbVar17;
    if (pbVar17 <= pbVar22 && lVar16 != 0) {
      pxVar5->cur = pxVar9 + lVar16;
      htmlCharDataSAXCallback(ctxt,pbVar17,(int)lVar16,(int)local_80);
      pxVar9 = pxVar5->cur;
      local_9c = skip;
    }
    ctxt = local_70;
    pxVar5->cur = pxVar9 + (int)local_9c;
    if (0 < replSize) {
      htmlCharDataSAXCallback(local_70,local_58,replSize,(int)local_80);
    }
    pxVar6 = ctxt->input;
    if ((((pxVar6->flags & 0x40) == 0) && (500 < (long)pxVar6->cur - (long)pxVar6->base)) &&
       ((long)pxVar6->end - (long)pxVar6->cur < 500)) {
      xmlParserShrink(ctxt);
      ctxt = local_70;
    }
    uVar13 = local_60;
  } while (!bVar19);
  pxVar5->line = local_4c;
  pxVar5->col = (int)uVar13;
  iVar7 = 0;
  if ((int)local_40 == 0) {
    iVar7 = (uint)local_80;
  }
  ctxt->endCheckState = iVar7;
  return (int)local_40;
LAB_0016501c:
  if ((len <= uVar18) || (0x1f < uVar18)) goto LAB_0016509d;
  if ((0x19 < (byte)((pbVar22[uVar18] | 0x20) + 0x9f)) &&
     ((uVar18 < 2 || (9 < (byte)(pbVar22[uVar18] - 0x30))))) goto LAB_001650a6;
  uVar18 = uVar18 + 1;
  goto LAB_0016501c;
LAB_0016509d:
  if (len <= uVar18) {
    uVar14 = (ulong)(iVar11 + iVar15 + 1);
    pbVar22 = pbVar21 + uVar20;
    goto LAB_00165623;
  }
LAB_001650a6:
  local_48 = pbVar17;
  local_58 = htmlFindEntityPrefix(pbVar21 + uVar20 + 1,~uVar20 + uVar8,0,&skip,&replSize);
  ctxt = local_70;
  pbVar17 = local_48;
  if (local_58 != (xmlChar *)0x0) {
    local_9c = skip + 1;
    uVar14 = (ulong)((int)local_60 + iVar15 + 1);
    pbVar22 = pbVar21 + uVar20;
    bVar19 = false;
    skip = local_9c;
    goto LAB_0016531e;
  }
  skip = 0;
  local_58 = (xmlChar *)0x0;
  iVar15 = 0;
  uStack_b0 = 1;
  local_9c = 1;
LAB_00165261:
  if ((local_78 != 0) && (len <= uStack_b0)) {
LAB_00165436:
    bVar19 = true;
    goto LAB_00165319;
  }
  uVar12 = (uint)local_68;
  str = local_88;
  goto LAB_00164d90;
LAB_00165188:
  uVar1 = uVar20 + uVar18;
  uStack_b0 = len;
  if (len <= uVar1) goto LAB_00164f93;
  bVar4 = ctxt->name[uVar18];
  if ((bVar4 == 0) || (bVar4 != (pbVar22[uVar18 + uVar20] | 0x20))) {
    uStack_b0 = uVar1;
    if (ctxt->name[uVar18 & 0xffffffff] == '\0') {
      bVar4 = pbVar22[uVar18 + uVar20];
      if ((((ulong)bVar4 < 0x3f) && ((0x4000800100000000U >> ((ulong)bVar4 & 0x3f) & 1) != 0)) ||
         (bVar4 != 0xb && (byte)(bVar4 - 9) < 5)) {
        if (((uint)local_80 == 5) && (bVar3 != 0x2f)) {
          uVar8 = 6;
        }
        else {
          uVar8 = 5;
          if ((uint)local_80 != 6) goto LAB_001654c8;
        }
      }
    }
    goto LAB_00164f93;
  }
  uVar18 = uVar18 + 1;
  goto LAB_00165188;
LAB_001654c8:
  bVar19 = true;
  local_9c = 0;
  local_40 = 1;
  goto LAB_0016531e;
LAB_00164f93:
  local_80 = uVar8;
  if ((local_78 != 0) && (len <= uStack_b0)) {
    local_80 = uVar8 & 0xffffffff;
LAB_00165623:
    bVar19 = true;
    local_9c = 0;
    goto LAB_0016531e;
  }
LAB_00164fd7:
  local_9c = 1;
  iVar15 = 0;
LAB_00164d90:
  str = str + local_9c;
  len = len - local_9c;
LAB_00164def:
  iVar7 = ctxt->disableSAX;
  uVar13 = (ulong)uVar12;
  pbVar22 = str;
  goto LAB_00164c77;
}

Assistant:

static int
htmlParseCharData(htmlParserCtxtPtr ctxt, int partial) {
    xmlParserInputPtr input = ctxt->input;
    xmlChar utf8Char[4];
    int complete = 0;
    int done = 0;
    int mode;
    int eof = PARSER_PROGRESSIVE(ctxt);
    int line, col;

    mode = ctxt->endCheckState;

    line = input->line;
    col = input->col;

    while (!PARSER_STOPPED(ctxt)) {
        const xmlChar *chunk, *in, *repl;
        size_t avail;
        int replSize;
        int skip = 0;
        int ncr = 0;
        int ncrSize = 0;
        int cp = 0;

        chunk = input->cur;
        avail = input->end - chunk;
        in = chunk;

        repl = BAD_CAST "";
        replSize = 0;

        while (!PARSER_STOPPED(ctxt)) {
            size_t j;
            int cur, size;

            if (avail <= 64) {
                if (!eof) {
                    size_t oldAvail = avail;
                    size_t off = in - chunk;

                    input->cur = in;

                    xmlParserGrow(ctxt);

                    in = input->cur;
                    chunk = in - off;
                    input->cur = chunk;
                    avail = input->end - in;

                    if (oldAvail == avail)
                        eof = 1;
                }

                if (avail == 0) {
                    if ((partial) && (ncr)) {
                        in -= ncrSize;
                        ncrSize = 0;
                    }

                    done = 1;
                    break;
                }
            }

            /* Accelerator */
            if (!ncr) {
                while (avail > 0) {
                    static const unsigned mask[8] = {
                        0x00002401, 0x10002040,
                        0x00000000, 0x00000000,
                        0xFFFFFFFF, 0xFFFFFFFF,
                        0xFFFFFFFF, 0xFFFFFFFF
                    };
                    cur = *in;
                    if ((1u << (cur & 0x1F)) & mask[cur >> 5])
                        break;
                    col += 1;
                    in += 1;
                    avail -= 1;
                }

                if ((!eof) && (avail <= 64))
                    continue;
                if (avail == 0)
                    continue;
            }

            cur = *in;
            size = 1;
            col += 1;

            if (ncr) {
                int lc = cur | 0x20;
                int digit;

                if ((cur >= '0') && (cur <= '9')) {
                    digit = cur - '0';
                } else if ((ncr == 16) && (lc >= 'a') && (lc <= 'f')) {
                    digit = (lc - 'a') + 10;
                } else {
                    if (cur == ';') {
                        in += 1;
                        size += 1;
                        ncrSize += 1;
                    }
                    goto next_chunk;
                }

                cp = cp * ncr + digit;
                if (cp >= 0x110000)
                    cp = 0x110000;

                ncrSize += 1;

                goto next_char;
            }

            switch (cur) {
            case '<':
                if (mode == 0) {
                    done = 1;
                    complete = 1;
                    goto next_chunk;
                }
                if (mode == DATA_PLAINTEXT)
                    break;

                j = 1;
                if (j < avail) {
                    if ((mode == DATA_SCRIPT) && (in[j] == '!')) {
                        /* Check for comment start */

                        j += 1;
                        if ((j < avail) && (in[j] == '-')) {
                            j += 1;
                            if ((j < avail) && (in[j] == '-'))
                                mode = DATA_SCRIPT_ESC1;
                        }
                    } else {
                        int i = 0;
                        int solidus = 0;

                        /* Check for tag */

                        if (in[j] == '/') {
                            j += 1;
                            solidus = 1;
                        }

                        if ((solidus) || (mode == DATA_SCRIPT_ESC1)) {
                            while ((j < avail) &&
                                   (ctxt->name[i] != 0) &&
                                   (ctxt->name[i] == (in[j] | 0x20))) {
                                i += 1;
                                j += 1;
                            }

                            if ((ctxt->name[i] == 0) && (j < avail)) {
                                int c = in[j];

                                if ((c == '>') || (c == '/') ||
                                    (IS_WS_HTML(c))) {
                                    if ((mode == DATA_SCRIPT_ESC1) &&
                                        (!solidus)) {
                                        mode = DATA_SCRIPT_ESC2;
                                    } else if (mode == DATA_SCRIPT_ESC2) {
                                        mode = DATA_SCRIPT_ESC1;
                                    } else {
                                        complete = 1;
                                        done = 1;
                                        goto next_chunk;
                                    }
                                }
                            }
                        }
                    }
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '-':
                if ((mode != DATA_SCRIPT_ESC1) && (mode != DATA_SCRIPT_ESC2))
                    break;

                /* Check for comment end */

                j = 1;
                if ((j < avail) && (in[j] == '-')) {
                    j += 1;
                    if ((j < avail) && (in[j] == '>'))
                        mode = DATA_SCRIPT;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '&':
                if ((mode != 0) && (mode != DATA_RCDATA))
                    break;

                j = 1;

                if ((j < avail) && (in[j] == '#')) {
                    j += 1;
                    if (j < avail) {
                        if ((in[j] | 0x20) == 'x') {
                            j += 1;
                            if ((j < avail) && (IS_HEX_DIGIT(in[j]))) {
                                ncr = 16;
                                size = 3;
                                ncrSize = 3;
                                cp = 0;
                            }
                        } else if (IS_ASCII_DIGIT(in[j])) {
                            ncr = 10;
                            size = 2;
                            ncrSize = 2;
                            cp = 0;
                        }
                    }
                } else {
                    if (partial) {
                        int terminated = 0;
                        size_t i;

                        /*
                         * &CounterClockwiseContourIntegral; has 33 bytes.
                         */
                        for (i = 1; i < avail; i++) {
                            if ((i >= 32) ||
                                (!IS_ASCII_LETTER(in[i]) &&
                                 ((i < 2) || !IS_ASCII_DIGIT(in[i])))) {
                                terminated = 1;
                                break;
                            }
                        }

                        if (!terminated) {
                            done = 1;
                            goto next_chunk;
                        }
                    }

                    repl = htmlFindEntityPrefix(in + j,
                                                avail - j,
                                                /* isAttr */ 0,
                                                &skip, &replSize);
                    if (repl != NULL) {
                        skip += 1;
                        goto next_chunk;
                    }

                    skip = 0;
                }

                if ((partial) && (j >= avail)) {
                    done = 1;
                    goto next_chunk;
                }

                break;

            case '\0':
                skip = 1;
                repl = BAD_CAST "\xEF\xBF\xBD";
                replSize = 3;
                goto next_chunk;

            case '\n':
                line += 1;
                col = 1;
                break;

            case '\r':
                if (partial && avail < 2) {
                    done = 1;
                    goto next_chunk;
                }

                skip = 1;
                if (in[1] != 0x0A) {
                    repl = BAD_CAST "\x0A";
                    replSize = 1;
                }
                goto next_chunk;

            default:
                if (cur < 0x80)
                    break;

                if ((input->flags & XML_INPUT_HAS_ENCODING) == 0) {
                    xmlChar * guess;

                    if (in > chunk)
                        goto next_chunk;

#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
                    guess = NULL;
#else
                    guess = htmlFindEncoding(ctxt);
#endif
                    if (guess == NULL) {
                        xmlSwitchEncoding(ctxt, XML_CHAR_ENCODING_8859_1);
                    } else {
                        xmlSwitchEncodingName(ctxt, (const char *) guess);
                        xmlFree(guess);
                    }
                    input->flags |= XML_INPUT_HAS_ENCODING;

                    eof = PARSER_PROGRESSIVE(ctxt);
                    goto restart;
                }

                size = htmlValidateUtf8(ctxt, in, avail, partial);

                if ((partial) && (size == 0)) {
                    done = 1;
                    goto next_chunk;
                }

                if (size <= 0) {
                    skip = 1;
                    repl = BAD_CAST "\xEF\xBF\xBD";
                    replSize = 3;
                    goto next_chunk;
                }

                break;
            }

next_char:
            in += size;
            avail -= size;
        }

next_chunk:
        if (ncrSize > 0) {
            skip = ncrSize;
            in -= ncrSize;

            repl = htmlCodePointToUtf8(cp, utf8Char, &replSize);
        }

        if (in > chunk) {
            input->cur += in - chunk;
            htmlCharDataSAXCallback(ctxt, chunk, in - chunk, mode);
        }

        input->cur += skip;
        if (replSize > 0)
            htmlCharDataSAXCallback(ctxt, repl, replSize, mode);

        SHRINK;

        if (done)
            break;

restart:
        ;
    }

    input->line = line;
    input->col = col;

    if (complete)
        ctxt->endCheckState = 0;
    else
        ctxt->endCheckState = mode;

    return(complete);
}